

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool>
               (interval_t *ldata,interval_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  unsigned_long *puVar6;
  long lVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  ulong uVar14;
  idx_t idx_in_entry;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar17 = 0;
      do {
        uVar12 = uVar17;
        if (psVar2 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar2[uVar17];
        }
        uVar14 = uVar17;
        if (psVar3 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar3[uVar17];
        }
        lVar7._0_4_ = ldata[uVar12].months;
        lVar7._4_4_ = ldata[uVar12].days;
        lVar4 = ldata[uVar12].micros;
        lVar8._0_4_ = rdata[uVar14].months;
        lVar8._4_4_ = rdata[uVar14].days;
        lVar5 = rdata[uVar14].micros;
        if ((lVar7 == lVar8) && (lVar4 == lVar5)) {
          bVar18 = false;
        }
        else {
          lVar15 = (lVar7 >> 0x20) + lVar4 / 86400000000;
          lVar16 = (lVar8 >> 0x20) + lVar5 / 86400000000;
          bVar18 = true;
          if (((long)(int)(undefined4)lVar7 + lVar15 / 0x1e ==
               (long)(int)(undefined4)lVar8 + lVar16 / 0x1e) && (lVar15 % 0x1e == lVar16 % 0x1e)) {
            bVar18 = lVar4 % 86400000000 != lVar5 % 86400000000;
          }
        }
        result_data[uVar17] = bVar18;
        uVar17 = uVar17 + 1;
      } while (count != uVar17);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar17 = 0;
    do {
      uVar12 = uVar17;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar17];
      }
      uVar14 = uVar17;
      if (psVar3 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar3[uVar17];
      }
      puVar6 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
         && ((puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))
         ) {
        lVar4._0_4_ = ldata[uVar12].months;
        lVar4._4_4_ = ldata[uVar12].days;
        lVar7 = ldata[uVar12].micros;
        lVar5._0_4_ = rdata[uVar14].months;
        lVar5._4_4_ = rdata[uVar14].days;
        lVar8 = rdata[uVar14].micros;
        if ((lVar4 == lVar5) && (lVar7 == lVar8)) {
          bVar18 = false;
        }
        else {
          lVar15 = (lVar4 >> 0x20) + lVar7 / 86400000000;
          lVar16 = (lVar5 >> 0x20) + lVar8 / 86400000000;
          bVar18 = true;
          if (((long)(int)(undefined4)lVar4 + lVar15 / 0x1e ==
               (long)(int)(undefined4)lVar5 + lVar16 / 0x1e) && (lVar15 % 0x1e == lVar16 % 0x1e)) {
            bVar18 = lVar7 % 86400000000 != lVar8 % 86400000000;
          }
        }
        result_data[uVar17] = bVar18;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var11 = p_Stack_50;
          peVar10 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar10;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var11;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar17 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar17 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      }
      uVar17 = uVar17 + 1;
    } while (count != uVar17);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}